

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

int p2t::cmp(void *param_1,void *param_2)

{
  Point *b_local;
  Point *a_local;
  
  if (*(double *)((long)param_2 + 8) <= *(double *)((long)param_1 + 8)) {
    if (((*(double *)((long)param_1 + 8) != *(double *)((long)param_2 + 8)) ||
        (NAN(*(double *)((long)param_1 + 8)) || NAN(*(double *)((long)param_2 + 8)))) ||
       (*param_2 <= *param_1)) {
      a_local._7_1_ = 0;
    }
    else {
      a_local._7_1_ = 1;
    }
  }
  else {
    a_local._7_1_ = 1;
  }
  return (int)CONCAT71((int7)((ulong)param_2 >> 8),a_local._7_1_);
}

Assistant:

inline bool cmp(const Point* a, const Point* b)
{
  if (a->y < b->y) {
    return true;
  } else if (a->y == b->y) {
    // Make sure q is point with greater x value
    if (a->x < b->x) {
      return true;
    }
  }
  return false;
}